

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_random_round_trip.cpp
# Opt level: O2

void __thiscall rtrip::~rtrip(rtrip *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

TEST_P(rtrip, testConversions)
{
    if (sizeof(UNITS_BASE_TYPE) == 4) {
        unsigned int start = GetParam();
        detail::unit_data unitdata(nullptr);
        memcpy(static_cast<void*>(&unitdata), &start, 4);
        auto startunit = unit(unitdata);
        auto str = to_string(startunit);
        auto resunit = unit_cast(unit_from_string(str));
        EXPECT_EQ(startunit, resunit) << "round trip failed " << start;
    }
}